

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::rebuild
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t numPrimitives,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  float fVar1;
  BBox1f BVar2;
  unsigned_long uVar3;
  int iVar4;
  char cVar5;
  unsigned_long uVar6;
  runtime_error *this_00;
  unsigned_long uVar7;
  long lVar8;
  unsigned_long uVar9;
  size_t sVar10;
  ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pPVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  size_t taskCount;
  SubdivRecalculatePrimRef recalculatePrimRef;
  SubdivPatch1 *subdiv_patches;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> sum;
  Iterator<embree::SubdivMesh,_true> iter;
  BVHNodeRecordMB4D<embree::NodeRefPtr<4>_> root;
  anon_class_1_0_00000001 local_22a;
  auto_partitioner local_229;
  unsigned_long local_228;
  char **local_220;
  BVHNSubdivPatch1MBlurBuilderSAH<4> *pBStack_218;
  mvector<BBox3fa> *local_210;
  char *local_208;
  anon_class_48_6_afa08d2e_conflict2 local_200;
  undefined1 local_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  anon_class_8_1_4d25ca37_conflict local_1b8;
  anon_class_8_1_898bcfc2_conflict10 local_1b0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_198;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_188;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined8 local_148;
  unsigned_long uStack_140;
  size_t local_138;
  ulong uStack_130;
  BBox1f local_128;
  undefined8 uStack_120;
  undefined **local_110;
  Scene *local_108;
  Iterator<embree::GridMesh,_false> local_100;
  anon_class_16_2_341d598e_conflict2 local_f0;
  anon_class_8_1_89912a77 local_e0;
  char **local_d8;
  mvector<BBox3fa> **local_d0;
  NodeRef local_c8;
  undefined8 uStack_c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  unsigned_long local_68;
  unsigned_long uStack_60;
  size_t local_58;
  ulong uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_168._8_8_ = local_168._0_8_;
  local_208 = (this->bvh->subdiv_patches).items;
  local_210 = &this->bounds;
  local_1c0 = local_208;
  FastAllocator::reset(&this->bvh->alloc);
  local_100.scene = this->scene;
  local_1b8.array2 = &local_100;
  local_100.all = false;
  local_200.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_c8;
  local_c8.ptr = 0x7f8000007f800000;
  uStack_c0 = 0x7f8000007f800000;
  local_b8._0_8_ = 0xff800000ff800000;
  local_b8._8_8_ = 0xff800000ff800000;
  local_a8._0_8_ = 0x7f8000007f800000;
  local_a8._8_8_ = 0x7f8000007f800000;
  local_98._0_8_ = 0xff800000ff800000;
  local_98._8_8_ = 0xff800000ff800000;
  local_88._0_8_ = 0x7f8000007f800000;
  local_88._8_8_ = 0x7f8000007f800000;
  local_78 = 0xff800000ff800000;
  uStack_70 = 0xff800000ff800000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0.0;
  fStack_44 = 1.0;
  fStack_40 = 1.0;
  fStack_3c = 0.0;
  local_f0.func = &local_e0;
  local_200.getSize = &local_1b8;
  local_200.func = &local_f0;
  uVar6 = (pstate->super_ParallelForForState).taskCount;
  local_200.taskCount = &local_228;
  local_200.reduction = &local_22a;
  local_1a8._12_2_ = 0x401;
  local_188 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
  local_168._0_8_ = 8;
  local_228 = uVar6;
  local_200.state = pstate;
  local_f0.array2 = (Iterator<embree::GridMesh,_true> *)local_1b8.array2;
  local_e0.t0t1 = (BBox1f *)this;
  local_d8 = &local_1c0;
  local_d0 = &local_210;
  tbb::detail::r1::initialize((task_group_context *)&local_1a8.field_1);
  local_1b0.func = &local_200;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar6,1,&local_1b0,&local_229,(task_group_context *)&local_1a8.field_1);
  cVar5 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_1a8.field_1);
  if (cVar5 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)&local_1a8.field_1);
  local_1a8._8_8_ = uStack_c0;
  local_1a8._0_8_ = local_c8.ptr;
  local_198._8_8_ = local_b8._8_8_;
  local_198._0_8_ = local_b8._0_8_;
  local_188._8_8_ = local_a8._8_8_;
  local_188._0_8_ = local_a8._0_8_;
  local_178._8_8_ = local_98._8_8_;
  local_178._0_8_ = local_98._0_8_;
  local_168._8_8_ = local_88._8_8_;
  local_168._0_8_ = local_88._0_8_;
  local_158._8_8_ = uStack_70;
  local_158._0_8_ = local_78;
  local_128.upper = fStack_44;
  local_128.lower = local_48;
  uStack_120 = CONCAT44(fStack_3c,fStack_40);
  uStack_130 = uStack_50;
  uStack_140 = local_68;
  local_138 = local_58;
  if (local_228 != 0) {
    pPVar11 = &pstate->prefix_state;
    uVar6 = local_68;
    uVar7 = uStack_60;
    uVar9 = local_228;
    fVar13 = fStack_40;
    fVar15 = fStack_3c;
    do {
      uVar17 = pPVar11->counts[0].max_num_time_segments;
      BVar2 = pPVar11->counts[0].max_time_range;
      fVar16 = pPVar11->counts[0].time_range.upper;
      pPVar11->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
      field_0 = local_1a8;
      pPVar11->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
      field_0 = local_198;
      pPVar11->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
      field_0 = local_188;
      pPVar11->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
      field_0 = local_178;
      pPVar11->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0 =
           local_168;
      pPVar11->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
           local_158;
      local_1a8.m128 =
           (__m128)minps(local_1a8.m128,
                         pPVar11->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                         geomBounds.bounds0.lower.field_0);
      local_198.m128 =
           (__m128)maxps(local_198.m128,
                         pPVar11->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                         geomBounds.bounds0.upper.field_0);
      local_188.m128 =
           (__m128)minps(local_188.m128,
                         pPVar11->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                         geomBounds.bounds1.lower.field_0);
      local_178.m128 =
           (__m128)maxps(local_178.m128,
                         pPVar11->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                         geomBounds.bounds1.upper.field_0);
      local_168.m128 =
           (__m128)minps(local_168.m128,
                         pPVar11->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                         centBounds.lower.field_0);
      local_158.m128 =
           (__m128)maxps(local_158.m128,
                         pPVar11->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                         centBounds.upper.field_0);
      fVar1 = pPVar11->counts[0].time_range.lower;
      fVar14 = fVar13;
      if (fVar1 <= fVar13) {
        fVar14 = fVar1;
      }
      uStack_140 = uVar6 + pPVar11->counts[0].object_range._begin;
      uVar3 = pPVar11->counts[0].object_range._end;
      sVar10 = local_138 + pPVar11->counts[0].num_time_segments;
      pPVar11->sums[0].num_time_segments = local_138;
      pPVar11->sums[0].max_num_time_segments = uStack_130;
      pPVar11->sums[0].object_range._begin = uVar6;
      pPVar11->sums[0].object_range._end = uVar7;
      pPVar11->sums[0].max_time_range = local_128;
      pPVar11->sums[0].time_range.lower = fVar13;
      pPVar11->sums[0].time_range.upper = fVar15;
      bVar12 = uStack_130 < uVar17;
      if (uStack_130 <= uVar17) {
        uStack_130 = uVar17;
      }
      if (fVar16 <= fVar15) {
        fVar16 = fVar15;
      }
      uVar17 = CONCAT44((int)((uint)bVar12 << 0x1f) >> 0x1f,(int)((uint)bVar12 << 0x1f) >> 0x1f);
      local_128 = (BBox1f)(~uVar17 & (ulong)local_128 | (ulong)BVar2 & uVar17);
      pPVar11 = (ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
                (pPVar11->counts + 1);
      uVar9 = uVar9 - 1;
      uVar6 = uStack_140;
      uVar7 = uVar7 + uVar3;
      fVar13 = fVar14;
      fVar15 = fVar16;
      local_138 = sVar10;
    } while (uVar9 != 0);
    uStack_120 = CONCAT44(fVar16,fVar14);
  }
  local_148 = 0;
  local_1c8 = 0x400;
  local_200.state =
       (ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)0x4;
  local_200.taskCount = (size_t *)0x50;
  for (iVar4 = 0x1f; 4U >> iVar4 == 0; iVar4 = iVar4 + -1) {
  }
  local_200.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)(long)iVar4;
  local_200.getSize = (anon_class_8_1_4d25ca37_conflict *)0x1;
  local_200.reduction = (anon_class_1_0_00000001 *)0x1;
  local_200.func = (anon_class_16_2_341d598e_conflict2 *)0x3f8000003f800000;
  local_1d0 = 0;
  lVar8 = *(long *)&(this->scene->super_AccelN).field_0x188;
  if (lVar8 != 0) {
    lVar8 = lVar8 + 0x550;
  }
  local_110 = &PTR_operator___02185a30;
  local_108 = (this->bvh->scene->progressInterface).scene;
  local_220 = &local_1c0;
  pBStack_218 = this;
  BVHBuilderMSMBlur::
  build<embree::NodeRefPtr<4>,embree::sse2::SubdivRecalculatePrimRef,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::rebuild(unsigned_long,embree::ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>>&)::_lambda(embree::sse2::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::Scene::BuildProgressMonitorInterface>
            (&local_c8,(BVHBuilderMSMBlur *)&this->primsMB,&local_1a8,lVar8,local_210,local_208,
             &this->bvh->alloc,&local_1c0,this,&local_110,&local_200);
  BVHN<4>::set(this->bvh,local_c8,(LBBox3fa *)&local_b8.field_1,local_138);
  return;
}

Assistant:

void rebuild(size_t numPrimitives, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        SubdivPatch1* const subdiv_patches = (SubdivPatch1*) bvh->subdiv_patches.data();
        SubdivRecalculatePrimRef recalculatePrimRef(bounds,subdiv_patches);
        bvh->alloc.reset();

        Scene::Iterator<SubdivMesh,true> iter(scene);
        PrimInfoMB pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB
        {
          size_t s = 0;
          size_t sMB = 0;
          PrimInfoMB pinfo(empty);
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {
            if (!mesh->valid(f)) continue;
            
            BVH_Allocator alloc(bvh);
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              const size_t patchIndex = base.begin()+s;
              const size_t patchIndexMB = base.end()+sMB;
              assert(patchIndex < numPrimitives);

              for (size_t t=0; t<mesh->numTimeSteps; t++)
              {
                SubdivPatch1Base& patch = subdiv_patches[patchIndexMB+t];
                new (&patch) SubdivPatch1(unsigned(geomID),unsigned(f),subPatch,mesh,t,uv,edge_level,subdiv,VSIZEX);
              }
              SubdivPatch1Base& patch0 = subdiv_patches[patchIndexMB];
              patch0.root_ref.set((int64_t) GridSOA::create(&patch0,(unsigned)mesh->numTimeSteps,scene,alloc,&bounds[patchIndexMB]));
              primsMB[patchIndex] = recalculatePrimRef(patchIndexMB,mesh->time_range,mesh->numTimeSegments(),BBox1f(0.0f,1.0f));
              s++;
              sMB += mesh->numTimeSteps;
              pinfo.add_primref(primsMB[patchIndex]);
            });
          }
          pinfo.object_range._begin = s;
          pinfo.object_range._end = sMB;
          return pinfo;
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        pinfo.object_range._end = pinfo.begin();
        pinfo.object_range._begin = 0;

        auto createLeafFunc = [&] (const BVHBuilderMSMBlur::BuildRecord& current, const Allocator& alloc) -> NodeRecordMB4D {
          mvector<PrimRefMB>& prims = *current.prims.prims;
          size_t items MAYBE_UNUSED = current.prims.size();
          assert(items == 1);
          const size_t patchIndexMB = prims[current.prims.begin()].ID();
          SubdivPatch1Base& patch = subdiv_patches[patchIndexMB+0];
          NodeRef node = bvh->encodeLeaf((char*)&patch,1);
          size_t patchNumTimeSteps = scene->get<SubdivMesh>(patch.geomID())->numTimeSteps;
          const LBBox3fa lbounds = LBBox3fa([&] (size_t itime) { return bounds[patchIndexMB+itime]; }, current.prims.time_range, (float)(patchNumTimeSteps-1));
          return NodeRecordMB4D(node,lbounds,current.prims.time_range);
        };

        /* configuration for BVH build */
        BVHBuilderMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxDepth;
        settings.logBlockSize = bsr(N);
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0f;
        settings.intCost = 1.0f;
        settings.singleLeafTimeSegment = false;

        /* build hierarchy */
        auto root =
          BVHBuilderMSMBlur::build<NodeRef>(primsMB,pinfo,scene->device,
                                             recalculatePrimRef,
                                             typename BVH::CreateAlloc(bvh),
                                             typename BVH::AABBNodeMB4D::Create(),
                                             typename BVH::AABBNodeMB4D::Set(),
                                             createLeafFunc,
                                             bvh->scene->progressInterface,
                                             settings);
        
        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
      }